

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_compare.cpp
# Opt level: O0

bool Omega_h::CompareArrays<long>::compare
               (CommPtr *comm,Read<long> *a,Read<long> *b,VarCompareOpts opts,Int ncomps,Int dim,
               bool verbose)

{
  void **this;
  bool bVar1;
  LO LVar2;
  int iVar3;
  I32 IVar4;
  element_type *peVar5;
  long lVar6;
  long *plVar7;
  char *pcVar8;
  ostream *poVar9;
  long lVar10;
  long lVar11;
  long comp;
  long global_ent;
  long global_comp;
  LO j;
  int best_rank;
  I32 rank_cand;
  long global_start;
  undefined1 local_98 [8];
  HostRead<long> h_b;
  undefined1 local_78 [8];
  HostRead<long> h_a;
  Read<long> local_58;
  Read<long> local_48;
  byte local_32;
  byte local_31;
  Int local_30;
  bool this_rank_matches;
  Int IStack_2c;
  bool verbose_local;
  Int dim_local;
  Int ncomps_local;
  Read<long> *b_local;
  Read<long> *a_local;
  CommPtr *comm_local;
  
  if (opts.type == NONE) {
    comm_local._7_1_ = 1;
  }
  else {
    local_31 = verbose;
    local_30 = dim;
    IStack_2c = ncomps;
    _dim_local = b;
    b_local = a;
    a_local = (Read<long> *)comm;
    Read<long>::Read(&local_48,(Read<int> *)a);
    Read<long>::Read(&local_58,(Read<int> *)b);
    bVar1 = Omega_h::operator==(&local_48,&local_58);
    Read<long>::~Read(&local_58);
    Read<long>::~Read(&local_48);
    local_32 = bVar1;
    peVar5 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)comm);
    bVar1 = Comm::reduce_and(peVar5,(bool)(local_32 & 1));
    if (bVar1) {
      comm_local._7_1_ = 1;
    }
    else if ((local_31 & 1) == 0) {
      comm_local._7_1_ = 0;
    }
    else {
      this = &h_b.read_.write_.shared_alloc_.direct_ptr;
      Read<long>::Read((Read<long> *)this,(Read<int> *)a);
      HostRead<long>::HostRead((HostRead<long> *)local_78,(Read<signed_char> *)this);
      Read<long>::~Read((Read<long> *)&h_b.read_.write_.shared_alloc_.direct_ptr);
      Read<long>::Read((Read<long> *)&global_start,(Read<int> *)b);
      HostRead<long>::HostRead((HostRead<long> *)local_98,(Read<signed_char> *)&global_start);
      Read<long>::~Read((Read<long> *)&global_start);
      peVar5 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)comm);
      LVar2 = HostRead<long>::size((HostRead<long> *)local_78);
      lVar6 = Comm::exscan<long>(peVar5,(long)LVar2,OMEGA_H_SUM);
      j = 0x7fffffff;
      if ((local_32 & 1) == 0) {
        peVar5 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)comm);
        j = Comm::rank(peVar5);
      }
      peVar5 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)comm);
      iVar3 = Comm::allreduce<int>(peVar5,j,OMEGA_H_MIN);
      peVar5 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)comm);
      IVar4 = Comm::rank(peVar5);
      if (IVar4 == iVar3) {
        for (global_comp._4_4_ = 0; LVar2 = HostRead<long>::size((HostRead<long> *)local_78),
            global_comp._4_4_ < LVar2; global_comp._4_4_ = global_comp._4_4_ + 1) {
          plVar7 = HostRead<long>::operator[]((HostRead<long> *)local_78,global_comp._4_4_);
          lVar10 = *plVar7;
          plVar7 = HostRead<long>::operator[]((HostRead<long> *)local_98,global_comp._4_4_);
          if (lVar10 != *plVar7) {
            lVar10 = (long)IStack_2c;
            lVar11 = (long)IStack_2c;
            pcVar8 = dimensional_singular_name(local_30);
            poVar9 = std::operator<<((ostream *)&std::cout,pcVar8);
            poVar9 = std::operator<<(poVar9,' ');
            poVar9 = (ostream *)
                     std::ostream::operator<<(poVar9,(lVar6 + global_comp._4_4_) / lVar10);
            poVar9 = std::operator<<(poVar9," comp ");
            poVar9 = (ostream *)
                     std::ostream::operator<<(poVar9,(lVar6 + global_comp._4_4_) % lVar11);
            poVar9 = std::operator<<(poVar9," ");
            plVar7 = HostRead<long>::operator[]((HostRead<long> *)local_78,global_comp._4_4_);
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,*plVar7);
            poVar9 = std::operator<<(poVar9," != ");
            plVar7 = HostRead<long>::operator[]((HostRead<long> *)local_98,global_comp._4_4_);
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,*plVar7);
            std::operator<<(poVar9,'\n');
            break;
          }
        }
      }
      comm_local._7_1_ = 0;
      HostRead<long>::~HostRead((HostRead<long> *)local_98);
      HostRead<long>::~HostRead((HostRead<long> *)local_78);
    }
  }
  return (bool)(comm_local._7_1_ & 1);
}

Assistant:

static bool compare(CommPtr comm, Read<T> a, Read<T> b, VarCompareOpts opts,
      Int ncomps, Int dim, bool verbose) {
    if (opts.type == VarCompareOpts::NONE) return true;
    auto this_rank_matches = (a == b);
    if (comm->reduce_and(this_rank_matches)) return true;
    if (!verbose) return false;
    /* if integer arrays are different, we find the first mismatching
       value and print it out as a place for users to start
       tracking down the issue */
    auto h_a = HostRead<T>(a);
    auto h_b = HostRead<T>(b);
    auto global_start = comm->exscan(GO(h_a.size()), OMEGA_H_SUM);
    I32 rank_cand = ArithTraits<I32>::max();
    if (!this_rank_matches) rank_cand = comm->rank();
    // only the first mismatching rank prints
    auto best_rank = comm->allreduce(rank_cand, OMEGA_H_MIN);
    if (comm->rank() == best_rank) {
      for (LO j = 0; j < h_a.size(); ++j) {
        // and it only prints its first mismatching value
        if (h_a[j] != h_b[j]) {
          auto global_comp = global_start + GO(j);
          auto global_ent = global_comp / ncomps;
          auto comp = global_comp % ncomps;
          std::cout << dimensional_singular_name(dim) << ' ' << global_ent
                    << " comp " << comp << " " << I64(h_a[j])
                    << " != " << I64(h_b[j]) << '\n';
          break;
        }
      }
    }
    return false;
  }